

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O0

int ccall_classify_struct(CTState *cts,CType *ct,int *rcl,CTSize ofs)

{
  uint ofs_00;
  CTSize fofs;
  CTSize ofs_local;
  int *rcl_local;
  CType *ct_local;
  CTState *cts_local;
  CType *local_98;
  CType *local_88;
  
  rcl_local = (int *)ct;
  if (ct->size < 0x11) {
    while ((short)rcl_local[2] != 0) {
      rcl_local = (int *)(cts->tab + *(ushort *)(rcl_local + 2));
      ofs_00 = ofs + ((CType *)rcl_local)->size;
      local_88 = (CType *)rcl_local;
      if (((CType *)rcl_local)->info >> 0x1c == 9) {
        do {
          local_88 = cts->tab + (local_88->info & 0xffff);
        } while (local_88->info >> 0x1c == 8);
        ccall_classify_ct(cts,local_88,rcl,ofs_00);
      }
      else if (((CType *)rcl_local)->info >> 0x1c == 10) {
        rcl[(int)(uint)(7 < ofs_00)] = rcl[(int)(uint)(7 < ofs_00)] | 1;
      }
      else {
        local_98 = (CType *)rcl_local;
        if ((((CType *)rcl_local)->info & 0xf0ff0000) == 0x80030000) {
          do {
            local_98 = cts->tab + (local_98->info & 0xffff);
          } while (local_98->info >> 0x1c == 8);
          ccall_classify_struct(cts,local_98,rcl,ofs_00);
        }
      }
    }
    cts_local._0_4_ = (*rcl | rcl[1]) & 4;
  }
  else {
    cts_local._0_4_ = 4;
  }
  return (uint)cts_local;
}

Assistant:

static int ccall_classify_struct(CTState *cts, CType *ct, int *rcl, CTSize ofs)
{
  if (ct->size > 16) return CCALL_RCL_MEM;  /* Too big, gets memory class. */
  while (ct->sib) {
    CTSize fofs;
    ct = ctype_get(cts, ct->sib);
    fofs = ofs+ct->size;
    if (ctype_isfield(ct->info))
      ccall_classify_ct(cts, ctype_rawchild(cts, ct), rcl, fofs);
    else if (ctype_isbitfield(ct->info))
      rcl[(fofs >= 8)] |= CCALL_RCL_INT;  /* NYI: unaligned bitfields? */
    else if (ctype_isxattrib(ct->info, CTA_SUBTYPE))
      ccall_classify_struct(cts, ctype_rawchild(cts, ct), rcl, fofs);
  }
  return ((rcl[0]|rcl[1]) & CCALL_RCL_MEM);  /* Memory class? */
}